

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_7::convertToXdr
               (Data *ofd,Array<char> *tileBuffer,int numScanLines,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine)

{
  char *numPixels;
  size_type sVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  int in_EDX;
  Array *in_RSI;
  long in_RDI;
  Int64 numPixelsPerScanLine;
  TOutSliceInfo *slice;
  uint i;
  int y;
  char *readPtr;
  char *writePtr;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 in_stack_ffffffffffffffe8;
  
  numPixels = Array::operator_cast_to_char_(in_RSI);
  for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
    local_38 = 0;
    while( true ) {
      sVar1 = std::
              vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
              ::size((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                      *)(in_RDI + 0x120));
      if (sVar1 <= local_38) break;
      std::
      vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
      ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                    *)(in_RDI + 0x120),(ulong)local_38);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RCX,(long)local_34);
      convertInPlace((char **)in_RSI,(char **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                     (PixelType)((ulong)in_RCX >> 0x20),(size_t)numPixels);
      local_38 = local_38 + 1;
    }
  }
  return;
}

Assistant:

void
convertToXdr (DeepTiledOutputFile::Data *ofd,
              Array<char>& tileBuffer,
              int numScanLines,
              vector<Int64>& bytesPerLine)
{
    //
    // Convert the contents of a TiledOutputFile's tileBuffer from the
    // machine's native representation to Xdr format. This function is called
    // by writeTile(), below, if the compressor wanted its input pixel data
    // in the machine's native format, but then failed to compress the data
    // (most compressors will expand rather than compress random input data).
    //
    // Note that this routine assumes that the machine's native representation
    // of the pixel data has the same size as the Xdr representation.  This
    // makes it possible to convert the pixel data in place, without an
    // intermediate temporary buffer.
    //

    //
    // Set these to point to the start of the tile.
    // We will write to toPtr, and read from fromPtr.
    //

    char *writePtr = tileBuffer;
    const char *readPtr = writePtr;

    //
    // Iterate over all scan lines in the tile.
    //

    for (int y = 0; y < numScanLines; ++y)
    {
        //
        // Iterate over all slices in the file.
        //

        for (unsigned int i = 0; i < ofd->slices.size(); ++i)
        {
            const TOutSliceInfo &slice = *ofd->slices[i];

            //
            // Convert the samples in place.
            //

            Int64 numPixelsPerScanLine = bytesPerLine[y];

            convertInPlace (writePtr, readPtr, slice.type,
                            numPixelsPerScanLine);
        }
    }

    #ifdef DEBUG

        assert (writePtr == readPtr);

    #endif
}